

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressBlockDiffFlipC
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  int in_ECX;
  long in_RDX;
  uint in_ESI;
  uint in_EDI;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int y_7;
  int x_7;
  int y_6;
  int x_6;
  int y_5;
  int x_5;
  int y_4;
  int x_4;
  uint pixel_indices_LSB_1;
  uint pixel_indices_MSB_1;
  int y_3;
  int x_3;
  int y_2;
  int x_2;
  int y_1;
  int x_1;
  int y;
  int x;
  uint pixel_indices_LSB;
  uint pixel_indices_MSB;
  int flipbit;
  int diffbit;
  int b;
  int g;
  int r;
  int shift;
  int index;
  int table;
  char diff [3];
  uint8 enc_color2 [3];
  uint8 enc_color1 [3];
  uint8 avg_color [3];
  char local_158;
  char local_154;
  char local_150;
  char local_14c;
  char local_148;
  char local_144;
  char local_140;
  char local_13c;
  char local_138;
  char local_134;
  char local_130;
  char local_12c;
  char local_128;
  char local_124;
  char local_120;
  char local_11c;
  char local_118;
  char local_114;
  char local_110;
  char local_10c;
  char local_108;
  char local_104;
  char local_100;
  char local_fc;
  char local_f8;
  char local_f4;
  char local_f0;
  char local_ec;
  char local_e8;
  char local_e4;
  char local_e0;
  char local_dc;
  char local_d8;
  char local_d4;
  char local_d0;
  char local_cc;
  char local_c8;
  char local_c4;
  char local_c0;
  char local_bc;
  char local_b8;
  char local_b4;
  char local_b0;
  char local_ac;
  char local_a8;
  char local_a4;
  char local_a0;
  char local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  
  uVar14 = in_EDI & 1;
  bVar8 = (byte)(in_EDI >> 8);
  bVar7 = (byte)(in_EDI >> 0x10);
  bVar9 = (byte)(in_EDI >> 0x18);
  if ((in_EDI >> 1 & 1) == 0) {
    bVar4 = (byte)(in_EDI >> 0x14) & 0xf;
    bVar5 = (byte)(in_EDI >> 0xc) & 0xf;
    bVar6 = bVar9 >> 4 | (bVar9 >> 4) << 4;
    bVar4 = bVar4 | bVar4 << 4;
    bVar5 = bVar5 | bVar5 << 4;
    iVar15 = (in_EDI >> 5 & 7) << 1;
    if (uVar14 == 0) {
      bVar12 = 0;
      for (local_54 = in_R9D; local_54 < in_R9D + 2; local_54 = local_54 + 1) {
        for (local_58 = in_stack_00000008; local_58 < in_stack_00000008 + 4; local_58 = local_58 + 1
            ) {
          bVar10 = bVar12 & 0x1f;
          bVar11 = bVar12 & 0x1f;
          bVar12 = bVar12 + 1;
          iVar1 = unscramble
                  [(int)((in_ESI & 0xffff) >> bVar11 & 1 | ((in_ESI >> 0x10) >> bVar10 & 1) << 1)];
          if ((int)((uint)bVar6 + compressParams[iVar15][iVar1]) < 0) {
            local_9c = '\0';
          }
          else {
            if ((int)((uint)bVar6 + compressParams[iVar15][iVar1]) < 0x100) {
              local_a0 = bVar6 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_a0 = -1;
            }
            local_9c = local_a0;
          }
          *(char *)(in_RDX + in_stack_00000010 * (local_58 * in_ECX + local_54)) = local_9c;
          if ((int)((uint)bVar4 + compressParams[iVar15][iVar1]) < 0) {
            local_a4 = '\0';
          }
          else {
            if ((int)((uint)bVar4 + compressParams[iVar15][iVar1]) < 0x100) {
              local_a8 = bVar4 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_a8 = -1;
            }
            local_a4 = local_a8;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_58 * in_ECX + local_54) + 1)) = local_a4;
          if ((int)((uint)bVar5 + compressParams[iVar15][iVar1]) < 0) {
            local_ac = '\0';
          }
          else {
            if ((int)((uint)bVar5 + compressParams[iVar15][iVar1]) < 0x100) {
              local_b0 = bVar5 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_b0 = -1;
            }
            local_ac = local_b0;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_58 * in_ECX + local_54) + 2)) = local_ac;
        }
      }
    }
    else {
      bVar12 = 0;
      for (local_5c = in_R9D; local_5c < in_R9D + 4; local_5c = local_5c + 1) {
        for (local_60 = in_stack_00000008; local_60 < in_stack_00000008 + 2; local_60 = local_60 + 1
            ) {
          bVar10 = bVar12 & 0x1f;
          bVar11 = bVar12 & 0x1f;
          bVar12 = bVar12 + 1;
          iVar1 = unscramble
                  [(int)((in_ESI & 0xffff) >> bVar11 & 1 | ((in_ESI >> 0x10) >> bVar10 & 1) << 1)];
          if ((int)((uint)bVar6 + compressParams[iVar15][iVar1]) < 0) {
            local_b4 = '\0';
          }
          else {
            if ((int)((uint)bVar6 + compressParams[iVar15][iVar1]) < 0x100) {
              local_b8 = bVar6 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_b8 = -1;
            }
            local_b4 = local_b8;
          }
          *(char *)(in_RDX + in_stack_00000010 * (local_60 * in_ECX + local_5c)) = local_b4;
          if ((int)((uint)bVar4 + compressParams[iVar15][iVar1]) < 0) {
            local_bc = '\0';
          }
          else {
            if ((int)((uint)bVar4 + compressParams[iVar15][iVar1]) < 0x100) {
              local_c0 = bVar4 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_c0 = -1;
            }
            local_bc = local_c0;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_60 * in_ECX + local_5c) + 1)) = local_bc;
          if ((int)((uint)bVar5 + compressParams[iVar15][iVar1]) < 0) {
            local_c4 = '\0';
          }
          else {
            if ((int)((uint)bVar5 + compressParams[iVar15][iVar1]) < 0x100) {
              local_c8 = bVar5 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_c8 = -1;
            }
            local_c4 = local_c8;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_60 * in_ECX + local_5c) + 2)) = local_c4;
        }
        bVar12 = bVar12 + 2;
      }
    }
    bVar7 = bVar7 & 0xf;
    bVar8 = bVar8 & 0xf;
    bVar9 = bVar9 & 0xf | (bVar9 & 0xf) << 4;
    bVar7 = bVar7 | bVar7 << 4;
    bVar8 = bVar8 | bVar8 << 4;
    iVar15 = (in_EDI >> 2 & 7) << 1;
    if (uVar14 == 0) {
      bVar6 = 8;
      for (local_64 = in_R9D + 2; local_64 < in_R9D + 4; local_64 = local_64 + 1) {
        for (local_68 = in_stack_00000008; local_68 < in_stack_00000008 + 4; local_68 = local_68 + 1
            ) {
          bVar4 = bVar6 & 0x1f;
          bVar5 = bVar6 & 0x1f;
          bVar6 = bVar6 + 1;
          iVar1 = unscramble
                  [(int)((in_ESI & 0xffff) >> bVar5 & 1 | ((in_ESI >> 0x10) >> bVar4 & 1) << 1)];
          if ((int)((uint)bVar9 + compressParams[iVar15][iVar1]) < 0) {
            local_cc = '\0';
          }
          else {
            if ((int)((uint)bVar9 + compressParams[iVar15][iVar1]) < 0x100) {
              local_d0 = bVar9 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_d0 = -1;
            }
            local_cc = local_d0;
          }
          *(char *)(in_RDX + in_stack_00000010 * (local_68 * in_ECX + local_64)) = local_cc;
          if ((int)((uint)bVar7 + compressParams[iVar15][iVar1]) < 0) {
            local_d4 = '\0';
          }
          else {
            if ((int)((uint)bVar7 + compressParams[iVar15][iVar1]) < 0x100) {
              local_d8 = bVar7 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_d8 = -1;
            }
            local_d4 = local_d8;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_68 * in_ECX + local_64) + 1)) = local_d4;
          if ((int)((uint)bVar8 + compressParams[iVar15][iVar1]) < 0) {
            local_dc = '\0';
          }
          else {
            if ((int)((uint)bVar8 + compressParams[iVar15][iVar1]) < 0x100) {
              local_e0 = bVar8 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_e0 = -1;
            }
            local_dc = local_e0;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_68 * in_ECX + local_64) + 2)) = local_dc;
        }
      }
    }
    else {
      bVar6 = 2;
      for (local_6c = in_R9D; local_6c < in_R9D + 4; local_6c = local_6c + 1) {
        for (local_70 = in_stack_00000008 + 2; local_70 < in_stack_00000008 + 4;
            local_70 = local_70 + 1) {
          bVar4 = bVar6 & 0x1f;
          bVar5 = bVar6 & 0x1f;
          bVar6 = bVar6 + 1;
          iVar1 = unscramble
                  [(int)((in_ESI & 0xffff) >> bVar5 & 1 | ((in_ESI >> 0x10) >> bVar4 & 1) << 1)];
          if ((int)((uint)bVar9 + compressParams[iVar15][iVar1]) < 0) {
            local_e4 = '\0';
          }
          else {
            if ((int)((uint)bVar9 + compressParams[iVar15][iVar1]) < 0x100) {
              local_e8 = bVar9 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_e8 = -1;
            }
            local_e4 = local_e8;
          }
          *(char *)(in_RDX + in_stack_00000010 * (local_70 * in_ECX + local_6c)) = local_e4;
          if ((int)((uint)bVar7 + compressParams[iVar15][iVar1]) < 0) {
            local_ec = '\0';
          }
          else {
            if ((int)((uint)bVar7 + compressParams[iVar15][iVar1]) < 0x100) {
              local_f0 = bVar7 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_f0 = -1;
            }
            local_ec = local_f0;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_70 * in_ECX + local_6c) + 1)) = local_ec;
          if ((int)((uint)bVar8 + compressParams[iVar15][iVar1]) < 0) {
            local_f4 = '\0';
          }
          else {
            if ((int)((uint)bVar8 + compressParams[iVar15][iVar1]) < 0x100) {
              local_f8 = bVar8 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_f8 = -1;
            }
            local_f4 = local_f8;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_70 * in_ECX + local_6c) + 2)) = local_f4;
        }
        bVar6 = bVar6 + 2;
      }
    }
  }
  else {
    bVar6 = bVar9 >> 3;
    bVar10 = (byte)(in_EDI >> 0x13) & 0x1f;
    bVar11 = (byte)(in_EDI >> 0xb) & 0x1f;
    bVar4 = bVar6 << 3 | (byte)((int)(uint)bVar6 >> 2);
    bVar5 = bVar10 << 3 | (byte)((int)(uint)bVar10 >> 2);
    bVar12 = bVar11 << 3 | (byte)((int)(uint)bVar11 >> 2);
    iVar15 = (in_EDI >> 5 & 7) << 1;
    if (uVar14 == 0) {
      bVar13 = 0;
      for (local_7c = in_R9D; local_7c < in_R9D + 2; local_7c = local_7c + 1) {
        for (local_80 = in_stack_00000008; local_80 < in_stack_00000008 + 4; local_80 = local_80 + 1
            ) {
          bVar2 = bVar13 & 0x1f;
          bVar3 = bVar13 & 0x1f;
          bVar13 = bVar13 + 1;
          iVar1 = unscramble
                  [(int)((in_ESI & 0xffff) >> bVar3 & 1 | ((in_ESI >> 0x10) >> bVar2 & 1) << 1)];
          if ((int)((uint)bVar4 + compressParams[iVar15][iVar1]) < 0) {
            local_fc = '\0';
          }
          else {
            if ((int)((uint)bVar4 + compressParams[iVar15][iVar1]) < 0x100) {
              local_100 = bVar4 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_100 = -1;
            }
            local_fc = local_100;
          }
          *(char *)(in_RDX + in_stack_00000010 * (local_80 * in_ECX + local_7c)) = local_fc;
          if ((int)((uint)bVar5 + compressParams[iVar15][iVar1]) < 0) {
            local_104 = '\0';
          }
          else {
            if ((int)((uint)bVar5 + compressParams[iVar15][iVar1]) < 0x100) {
              local_108 = bVar5 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_108 = -1;
            }
            local_104 = local_108;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_80 * in_ECX + local_7c) + 1)) = local_104;
          if ((int)((uint)bVar12 + compressParams[iVar15][iVar1]) < 0) {
            local_10c = '\0';
          }
          else {
            if ((int)((uint)bVar12 + compressParams[iVar15][iVar1]) < 0x100) {
              local_110 = bVar12 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_110 = -1;
            }
            local_10c = local_110;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_80 * in_ECX + local_7c) + 2)) = local_10c;
        }
      }
    }
    else {
      bVar13 = 0;
      for (local_84 = in_R9D; local_84 < in_R9D + 4; local_84 = local_84 + 1) {
        for (local_88 = in_stack_00000008; local_88 < in_stack_00000008 + 2; local_88 = local_88 + 1
            ) {
          bVar2 = bVar13 & 0x1f;
          bVar3 = bVar13 & 0x1f;
          bVar13 = bVar13 + 1;
          iVar1 = unscramble
                  [(int)((in_ESI & 0xffff) >> bVar3 & 1 | ((in_ESI >> 0x10) >> bVar2 & 1) << 1)];
          if ((int)((uint)bVar4 + compressParams[iVar15][iVar1]) < 0) {
            local_114 = '\0';
          }
          else {
            if ((int)((uint)bVar4 + compressParams[iVar15][iVar1]) < 0x100) {
              local_118 = bVar4 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_118 = -1;
            }
            local_114 = local_118;
          }
          *(char *)(in_RDX + in_stack_00000010 * (local_88 * in_ECX + local_84)) = local_114;
          if ((int)((uint)bVar5 + compressParams[iVar15][iVar1]) < 0) {
            local_11c = '\0';
          }
          else {
            if ((int)((uint)bVar5 + compressParams[iVar15][iVar1]) < 0x100) {
              local_120 = bVar5 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_120 = -1;
            }
            local_11c = local_120;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_88 * in_ECX + local_84) + 1)) = local_11c;
          if ((int)((uint)bVar12 + compressParams[iVar15][iVar1]) < 0) {
            local_124 = '\0';
          }
          else {
            if ((int)((uint)bVar12 + compressParams[iVar15][iVar1]) < 0x100) {
              local_128 = bVar12 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_128 = -1;
            }
            local_124 = local_128;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_88 * in_ECX + local_84) + 2)) = local_124;
        }
        bVar13 = bVar13 + 2;
      }
    }
    bVar6 = bVar6 + ((char)(bVar9 << 5) >> 5);
    bVar10 = bVar10 + ((char)(bVar7 << 5) >> 5);
    bVar11 = bVar11 + ((char)(bVar8 << 5) >> 5);
    bVar7 = bVar6 * '\b' | (byte)((int)(uint)bVar6 >> 2);
    bVar8 = bVar10 * '\b' | (byte)((int)(uint)bVar10 >> 2);
    bVar9 = bVar11 * '\b' | (byte)((int)(uint)bVar11 >> 2);
    iVar15 = (in_EDI >> 2 & 7) << 1;
    if (uVar14 == 0) {
      bVar6 = 8;
      for (local_8c = in_R9D + 2; local_8c < in_R9D + 4; local_8c = local_8c + 1) {
        for (local_90 = in_stack_00000008; local_90 < in_stack_00000008 + 4; local_90 = local_90 + 1
            ) {
          bVar4 = bVar6 & 0x1f;
          bVar5 = bVar6 & 0x1f;
          bVar6 = bVar6 + 1;
          iVar1 = unscramble
                  [(int)((in_ESI & 0xffff) >> bVar5 & 1 | ((in_ESI >> 0x10) >> bVar4 & 1) << 1)];
          if ((int)((uint)bVar7 + compressParams[iVar15][iVar1]) < 0) {
            local_12c = '\0';
          }
          else {
            if ((int)((uint)bVar7 + compressParams[iVar15][iVar1]) < 0x100) {
              local_130 = bVar7 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_130 = -1;
            }
            local_12c = local_130;
          }
          *(char *)(in_RDX + in_stack_00000010 * (local_90 * in_ECX + local_8c)) = local_12c;
          if ((int)((uint)bVar8 + compressParams[iVar15][iVar1]) < 0) {
            local_134 = '\0';
          }
          else {
            if ((int)((uint)bVar8 + compressParams[iVar15][iVar1]) < 0x100) {
              local_138 = bVar8 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_138 = -1;
            }
            local_134 = local_138;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_90 * in_ECX + local_8c) + 1)) = local_134;
          if ((int)((uint)bVar9 + compressParams[iVar15][iVar1]) < 0) {
            local_13c = '\0';
          }
          else {
            if ((int)((uint)bVar9 + compressParams[iVar15][iVar1]) < 0x100) {
              local_140 = bVar9 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_140 = -1;
            }
            local_13c = local_140;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_90 * in_ECX + local_8c) + 2)) = local_13c;
        }
      }
    }
    else {
      bVar6 = 2;
      for (local_94 = in_R9D; local_94 < in_R9D + 4; local_94 = local_94 + 1) {
        for (local_98 = in_stack_00000008 + 2; local_98 < in_stack_00000008 + 4;
            local_98 = local_98 + 1) {
          bVar4 = bVar6 & 0x1f;
          bVar5 = bVar6 & 0x1f;
          bVar6 = bVar6 + 1;
          iVar1 = unscramble
                  [(int)((in_ESI & 0xffff) >> bVar5 & 1 | ((in_ESI >> 0x10) >> bVar4 & 1) << 1)];
          if ((int)((uint)bVar7 + compressParams[iVar15][iVar1]) < 0) {
            local_144 = '\0';
          }
          else {
            if ((int)((uint)bVar7 + compressParams[iVar15][iVar1]) < 0x100) {
              local_148 = bVar7 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_148 = -1;
            }
            local_144 = local_148;
          }
          *(char *)(in_RDX + in_stack_00000010 * (local_98 * in_ECX + local_94)) = local_144;
          if ((int)((uint)bVar8 + compressParams[iVar15][iVar1]) < 0) {
            local_14c = '\0';
          }
          else {
            if ((int)((uint)bVar8 + compressParams[iVar15][iVar1]) < 0x100) {
              local_150 = bVar8 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_150 = -1;
            }
            local_14c = local_150;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_98 * in_ECX + local_94) + 1)) = local_14c;
          if ((int)((uint)bVar9 + compressParams[iVar15][iVar1]) < 0) {
            local_154 = '\0';
          }
          else {
            if ((int)((uint)bVar9 + compressParams[iVar15][iVar1]) < 0x100) {
              local_158 = bVar9 + (char)compressParams[iVar15][iVar1];
            }
            else {
              local_158 = -1;
            }
            local_154 = local_158;
          }
          *(char *)(in_RDX + (in_stack_00000010 * (local_98 * in_ECX + local_94) + 2)) = local_154;
        }
        bVar6 = bVar6 + 2;
      }
    }
  }
  return;
}

Assistant:

void decompressBlockDiffFlipC(unsigned int block_part1, unsigned int block_part2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	uint8 avg_color[3], enc_color1[3], enc_color2[3];
	signed char diff[3];
	int table;
	int index,shift;
	int r,g,b;
	int diffbit;
	int flipbit;

	diffbit = (GETBITSHIGH(block_part1, 1, 33));
	flipbit = (GETBITSHIGH(block_part1, 1, 32));

	if( !diffbit )
	{
		// We have diffbit = 0.

		// First decode left part of block.
		avg_color[0]= GETBITSHIGH(block_part1, 4, 63);
		avg_color[1]= GETBITSHIGH(block_part1, 4, 55);
		avg_color[2]= GETBITSHIGH(block_part1, 4, 47);

		// Here, we should really multiply by 17 instead of 16. This can
		// be done by just copying the four lower bits to the upper ones
		// while keeping the lower bits.
		avg_color[0] |= (avg_color[0] <<4);
		avg_color[1] |= (avg_color[1] <<4);
		avg_color[2] |= (avg_color[2] <<4);

		table = GETBITSHIGH(block_part1, 3, 39) << 1;

		unsigned int pixel_indices_MSB, pixel_indices_LSB;
			
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift = 0;
			for(int x=startx; x<startx+2; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift = 0;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty; y<starty+2; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift+=2;
			}
		}

		// Now decode other part of block. 
		avg_color[0]= GETBITSHIGH(block_part1, 4, 59);
		avg_color[1]= GETBITSHIGH(block_part1, 4, 51);
		avg_color[2]= GETBITSHIGH(block_part1, 4, 43);

		// Here, we should really multiply by 17 instead of 16. This can
		// be done by just copying the four lower bits to the upper ones
		// while keeping the lower bits.
		avg_color[0] |= (avg_color[0] <<4);
		avg_color[1] |= (avg_color[1] <<4);
		avg_color[2] |= (avg_color[2] <<4);

		table = GETBITSHIGH(block_part1, 3, 36) << 1;
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift=8;
			for(int x=startx+2; x<startx+4; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift=2;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty+2; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift += 2;
			}
		}
	}
	else
	{
		// We have diffbit = 1. 

//      63 62 61 60 59 58 57 56 55 54 53 52 51 50 49 48 47 46 45 44 43 42 41 40 39 38 37 36 35 34  33  32 
//      ---------------------------------------------------------------------------------------------------
//     | base col1    | dcol 2 | base col1    | dcol 2 | base col 1   | dcol 2 | table  | table  |diff|flip|
//     | R1' (5 bits) | dR2    | G1' (5 bits) | dG2    | B1' (5 bits) | dB2    | cw 1   | cw 2   |bit |bit |
//      ---------------------------------------------------------------------------------------------------
// 
// 
//     c) bit layout in bits 31 through 0 (in both cases)
// 
//      31 30 29 28 27 26 25 24 23 22 21 20 19 18 17 16 15 14 13 12 11 10  9  8  7  6  5  4  3   2   1  0
//      --------------------------------------------------------------------------------------------------
//     |       most significant pixel index bits       |         least significant pixel index bits       |  
//     | p| o| n| m| l| k| j| i| h| g| f| e| d| c| b| a| p| o| n| m| l| k| j| i| h| g| f| e| d| c | b | a |
//      --------------------------------------------------------------------------------------------------      

		// First decode left part of block.
		enc_color1[0]= GETBITSHIGH(block_part1, 5, 63);
		enc_color1[1]= GETBITSHIGH(block_part1, 5, 55);
		enc_color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Expand from 5 to 8 bits
		avg_color[0] = (enc_color1[0] <<3) | (enc_color1[0] >> 2);
		avg_color[1] = (enc_color1[1] <<3) | (enc_color1[1] >> 2);
		avg_color[2] = (enc_color1[2] <<3) | (enc_color1[2] >> 2);

		table = GETBITSHIGH(block_part1, 3, 39) << 1;

		unsigned int pixel_indices_MSB, pixel_indices_LSB;
			
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift = 0;
			for(int x=startx; x<startx+2; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift = 0;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty; y<starty+2; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift+=2;
			}
		}

		// Now decode right part of block. 
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		//  Calculale second color
		enc_color2[0]= enc_color1[0] + diff[0];
		enc_color2[1]= enc_color1[1] + diff[1];
		enc_color2[2]= enc_color1[2] + diff[2];

		// Expand from 5 to 8 bits
		avg_color[0] = (enc_color2[0] <<3) | (enc_color2[0] >> 2);
		avg_color[1] = (enc_color2[1] <<3) | (enc_color2[1] >> 2);
		avg_color[2] = (enc_color2[2] <<3) | (enc_color2[2] >> 2);

		table = GETBITSHIGH(block_part1, 3, 36) << 1;
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift=8;
			for(int x=startx+2; x<startx+4; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift=2;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty+2; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift += 2;
			}
		}
	}
}